

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

AimTarget * __thiscall aim_t::Result(aim_t *this)

{
  AimTarget *local_18;
  AimTarget *result;
  aim_t *this_local;
  
  local_18 = &this->linetarget;
  if ((local_18->super_FTranslatedLineTarget).linetarget == (AActor *)0x0) {
    if ((this->thing_other).super_FTranslatedLineTarget.linetarget == (AActor *)0x0) {
      if ((this->thing_friend).super_FTranslatedLineTarget.linetarget != (AActor *)0x0) {
        local_18 = &this->thing_friend;
      }
    }
    else {
      local_18 = &this->thing_other;
    }
  }
  return local_18;
}

Assistant:

AimTarget *Result()
	{
		AimTarget *result = &linetarget;
		if (result->linetarget == NULL)
		{
			if (thing_other.linetarget != NULL)
			{
				result = &thing_other;
			}
			else if (thing_friend.linetarget != NULL)
			{
				result = &thing_friend;
			}
		}
		return result;
	}